

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIImage::draw(CGUIImage *this)

{
  char cVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  rect<int> clippingRect_1;
  rect<int> clippingRect;
  rect<int> local_58;
  rect<int> local_48;
  rect<int> local_38;
  
  if (this->field_0xa0 != '\x01') {
    return;
  }
  plVar2 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  plVar3 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x30))();
  if (this->Texture == (ITexture *)0x0) {
    if (this->DrawBackground == true) {
      local_58.UpperLeftCorner.X = *(int *)&this->field_0x50;
      local_58.UpperLeftCorner.Y = *(int *)&this->field_0x54;
      local_58.LowerRightCorner.X = *(uint *)&this->field_0x58;
      local_58.LowerRightCorner.Y = *(uint *)&this->field_0x5c;
      checkBounds(this,&local_58);
      local_48.UpperLeftCorner.X = (**(code **)*plVar2)(plVar2,0);
      (**(code **)(*plVar2 + 0xa8))(plVar2,this,&local_48,&this->field_0x40,&local_58);
    }
    goto LAB_002210cd;
  }
  local_58.UpperLeftCorner = (this->SourceRect).UpperLeftCorner;
  local_58.LowerRightCorner.X = (this->SourceRect).LowerRightCorner.X;
  local_58.LowerRightCorner.Y = (this->SourceRect).LowerRightCorner.Y;
  if (local_58.LowerRightCorner.X == local_58.UpperLeftCorner.X) {
LAB_00220f7f:
    local_58.UpperLeftCorner.X = 0;
    local_58.UpperLeftCorner.Y = 0;
    local_58.LowerRightCorner = *(vector2d<int> *)&this->Texture->OriginalSize;
  }
  else if (local_58.LowerRightCorner.Y == local_58.UpperLeftCorner.Y) goto LAB_00220f7f;
  if (this->ScaleImage == true) {
    local_48.UpperLeftCorner.Y = (this->Color).color;
    local_48.UpperLeftCorner.X = local_48.UpperLeftCorner.Y;
    local_48.LowerRightCorner.Y = local_48.UpperLeftCorner.Y;
    local_48.LowerRightCorner.X = local_48.UpperLeftCorner.Y;
    local_38.UpperLeftCorner.X = *(int *)&this->field_0x50;
    local_38.UpperLeftCorner.Y = *(int *)&this->field_0x54;
    local_38.LowerRightCorner.X = *(int *)&this->field_0x58;
    local_38.LowerRightCorner.Y = *(int *)&this->field_0x5c;
    checkBounds(this,&local_38);
    (**(code **)(*plVar3 + 400))
              (plVar3,this->Texture,&this->field_0x40,&local_58,&local_38,&local_48,
               this->UseAlphaChannel);
  }
  else {
    local_48.UpperLeftCorner.X = *(int *)&this->field_0x40;
    local_48.UpperLeftCorner.Y = *(int *)&this->field_0x44;
    local_48.LowerRightCorner.X =
         local_48.UpperLeftCorner.X + (local_58.LowerRightCorner.X - local_58.UpperLeftCorner.X);
    local_48.LowerRightCorner.Y =
         local_48.UpperLeftCorner.Y + (local_58.LowerRightCorner.Y - local_58.UpperLeftCorner.Y);
    checkBounds(this,&local_48);
    core::rect<int>::clipAgainst(&local_48,(rect<int> *)&this->field_0x50);
    (**(code **)(*plVar3 + 0x180))
              (plVar3,this->Texture,&this->field_0x40,&local_58,&local_48,(this->Color).color,
               this->UseAlphaChannel);
  }
LAB_002210cd:
  cVar1 = (**(code **)(*(long *)this + 0x68))(this);
  if (cVar1 != '\0') {
    for (puVar4 = *(undefined8 **)&this->field_0x8; puVar4 != (undefined8 *)&this->field_0x8;
        puVar4 = (undefined8 *)*puVar4) {
      (**(code **)(*(long *)puVar4[2] + 0x50))();
    }
  }
  return;
}

Assistant:

void CGUIImage::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	video::IVideoDriver *driver = Environment->getVideoDriver();

	if (Texture) {
		core::rect<s32> sourceRect(SourceRect);
		if (sourceRect.getWidth() == 0 || sourceRect.getHeight() == 0) {
			sourceRect = core::rect<s32>(core::dimension2di(Texture->getOriginalSize()));
		}

		if (ScaleImage) {
			const video::SColor Colors[] = {Color, Color, Color, Color};

			core::rect<s32> clippingRect(AbsoluteClippingRect);
			checkBounds(clippingRect);

			driver->draw2DImage(Texture, AbsoluteRect, sourceRect,
					&clippingRect, Colors, UseAlphaChannel);
		} else {
			core::rect<s32> clippingRect(AbsoluteRect.UpperLeftCorner, sourceRect.getSize());
			checkBounds(clippingRect);
			clippingRect.clipAgainst(AbsoluteClippingRect);

			driver->draw2DImage(Texture, AbsoluteRect.UpperLeftCorner, sourceRect,
					&clippingRect, Color, UseAlphaChannel);
		}
	} else if (DrawBackground) {
		core::rect<s32> clippingRect(AbsoluteClippingRect);
		checkBounds(clippingRect);

		skin->draw2DRectangle(this, skin->getColor(EGDC_3D_DARK_SHADOW), AbsoluteRect, &clippingRect);
	}

	IGUIElement::draw();
}